

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O0

void __thiscall Excel::Record::Record(Record *this,Stream *stream)

{
  size_t in_RCX;
  void *__buf;
  Stream *in_RSI;
  Record *in_RDI;
  RecordSubstream *in_stack_ffffffffffffffe0;
  
  in_RDI->m_code = 0;
  in_RDI->m_length = 0;
  Stream::byteOrder(in_RSI);
  RecordSubstream::RecordSubstream(in_stack_ffffffffffffffe0,(ByteOrder)((ulong)in_RDI >> 0x20));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12fa27);
  read(in_RDI,(int)in_RSI,__buf,in_RCX);
  return;
}

Assistant:

inline
Record::Record( Stream & stream )
	:	m_code( 0 )
	,	m_length( 0 )
	,	m_stream( stream.byteOrder() )
{
	read( stream );
}